

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_crg_dumpparms(jpc_ms_t *ms,FILE *out)

{
  uint uVar1;
  ulong uVar2;
  jpc_crgcomp_t *pjVar3;
  
  if (0 < (ms->parms).soc) {
    pjVar3 = (ms->parms).crg.comps;
    uVar2 = 0;
    do {
      fprintf((FILE *)out,"hoff[%d] = %lu; voff[%d] = %lu\n",uVar2,pjVar3->hoff,uVar2,pjVar3->voff);
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
      pjVar3 = pjVar3 + 1;
    } while ((int)uVar1 < (ms->parms).soc);
  }
  return 0;
}

Assistant:

static int jpc_crg_dumpparms(jpc_ms_t *ms, FILE *out)
{
	jpc_crg_t *crg = &ms->parms.crg;
	int compno;
	jpc_crgcomp_t *comp;
	for (compno = 0, comp = crg->comps; compno < crg->numcomps; ++compno,
	  ++comp) {
		fprintf(out, "hoff[%d] = %"PRIuFAST16"; voff[%d] = %"PRIuFAST16"\n",
		  compno, comp->hoff, compno, comp->voff);
	}
	return 0;
}